

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CheckGlErrors.h
# Opt level: O2

bool GlLogCall(char *functionCall,char *file,int lineNo)

{
  int iVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  
  iVar1 = glGetError(functionCall,file,CONCAT44(in_register_00000014,lineNo));
  if (iVar1 != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[OpenGL Error] (");
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 8;
    poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)poVar2);
    *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) =
         *(uint *)(poVar2 + *(long *)(*(long *)poVar2 + -0x18) + 0x18) & 0xffffffb5 | 2;
    poVar2 = std::operator<<(poVar2,") ");
    poVar2 = std::operator<<(poVar2,functionCall);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = std::operator<<(poVar2,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/ruidfigueiredo[P]mesmerize-viewer/src/main.cpp"
                            );
    poVar2 = std::operator<<(poVar2,": ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(int)file);
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  return iVar1 == 0;
}

Assistant:

static bool GlLogCall(const char *functionCall, const char *file, int lineNo)
{
    GLenum error = glGetError();
    if (error == GL_NO_ERROR)
        return true;

    std::cout << "[OpenGL Error] ("
              << std::hex
              << error
              << std::dec << ") "
              << functionCall << " "
              << file << ": " << lineNo << std::endl;
    return false;
}